

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_brusselator1D_imexmri.c
# Opt level: O2

int fsi(sunrealtype t,N_Vector y,N_Vector ydot,void *user_data)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  int iVar13;
  void *returnvalue;
  undefined8 *returnvalue_00;
  long lVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  undefined4 uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  
  lVar17 = *user_data;
  auVar20 = *(undefined1 (*) [16])((long)user_data + 0x28);
  dVar4 = *(double *)((long)user_data + 0x38);
  dVar5 = *(double *)((long)user_data + 8);
  returnvalue = (void *)N_VGetArrayPointer();
  iVar13 = check_retval(returnvalue,"N_VGetArrayPointer",0);
  iVar16 = 1;
  if (iVar13 == 0) {
    returnvalue_00 = (undefined8 *)N_VGetArrayPointer(ydot);
    iVar13 = check_retval(returnvalue_00,"N_VGetArrayPointer",0);
    if (iVar13 == 0) {
      N_VConst(0,ydot);
      uVar18 = (undefined4)((ulong)dVar5 >> 0x20);
      auVar19._8_4_ = SUB84(dVar5,0);
      auVar19._0_8_ = dVar5;
      auVar19._12_4_ = uVar18;
      auVar19 = divpd(auVar20,auVar19);
      auVar20._8_4_ = SUB84(dVar5,0);
      auVar20._0_8_ = dVar5;
      auVar20._12_4_ = uVar18;
      auVar20 = divpd(auVar19,auVar20);
      lVar17 = lVar17 + -1;
      lVar15 = 0x28;
      for (lVar14 = 1; lVar14 < lVar17; lVar14 = lVar14 + 1) {
        dVar6 = *(double *)((long)returnvalue + lVar15);
        dVar7 = *(double *)((long)returnvalue + lVar15 + -0x18);
        pdVar1 = (double *)((long)returnvalue + lVar15 + -0x10);
        dVar9 = *pdVar1;
        dVar10 = pdVar1[1];
        pdVar1 = (double *)((long)returnvalue + lVar15 + -0x28);
        dVar11 = pdVar1[1];
        pdVar2 = (double *)((long)returnvalue + lVar15 + 8);
        dVar12 = pdVar2[1];
        dVar8 = *(double *)((long)returnvalue + lVar15 + 0x18);
        pdVar3 = (double *)((long)returnvalue_00 + lVar15 + -0x10);
        *pdVar3 = ((*pdVar1 - (dVar9 + dVar9)) + *pdVar2) * auVar20._0_8_;
        pdVar3[1] = ((dVar11 - (dVar10 + dVar10)) + dVar12) * auVar20._8_8_;
        *(double *)((long)returnvalue_00 + lVar15) =
             ((dVar7 - (dVar6 + dVar6)) + dVar8) * ((dVar4 / dVar5) / dVar5);
        lVar15 = lVar15 + 0x18;
      }
      *returnvalue_00 = 0;
      returnvalue_00[1] = 0;
      returnvalue_00[2] = 0;
      returnvalue_00[lVar17 * 3] = 0;
      (returnvalue_00 + lVar17 * 3)[1] = 0;
      returnvalue_00[lVar17 * 3 + 2] = 0;
      iVar16 = 0;
    }
  }
  return iVar16;
}

Assistant:

static int fsi(sunrealtype t, N_Vector y, N_Vector ydot, void* user_data)
{
  UserData udata     = (UserData)user_data; /* access problem data */
  sunindextype N     = udata->N;            /* set variable shortcuts */
  sunrealtype du     = udata->du;
  sunrealtype dv     = udata->dv;
  sunrealtype dw     = udata->dw;
  sunrealtype dx     = udata->dx;
  sunrealtype *Ydata = NULL, *dYdata = NULL;
  sunrealtype duconst, dvconst, dwconst, u, ul, ur, v, vl, vr, w, wl, wr;
  sunindextype i;

  Ydata = N_VGetArrayPointer(y); /* access data arrays */
  if (check_retval((void*)Ydata, "N_VGetArrayPointer", 0)) { return 1; }
  dYdata = N_VGetArrayPointer(ydot);
  if (check_retval((void*)dYdata, "N_VGetArrayPointer", 0)) { return 1; }
  N_VConst(0.0, ydot); /* initialize ydot to zero */

  /* iterate over domain, computing all equations */
  duconst = du / dx / dx;
  dvconst = dv / dx / dx;
  dwconst = dw / dx / dx;
  for (i = 1; i < N - 1; i++)
  {
    /* set shortcuts */
    u  = Ydata[IDX(i, 0)];
    ul = Ydata[IDX(i - 1, 0)];
    ur = Ydata[IDX(i + 1, 0)];
    v  = Ydata[IDX(i, 1)];
    vl = Ydata[IDX(i - 1, 1)];
    vr = Ydata[IDX(i + 1, 1)];
    w  = Ydata[IDX(i, 2)];
    wl = Ydata[IDX(i - 1, 2)];
    wr = Ydata[IDX(i + 1, 2)];

    /* Fill in ODE RHS for u */
    dYdata[IDX(i, 0)] = (ul - SUN_RCONST(2.0) * u + ur) * duconst;

    /* Fill in ODE RHS for v */
    dYdata[IDX(i, 1)] = (vl - SUN_RCONST(2.0) * v + vr) * dvconst;

    /* Fill in ODE RHS for w */
    dYdata[IDX(i, 2)] = (wl - SUN_RCONST(2.0) * w + wr) * dwconst;
  }

  /* enforce stationary boundaries */
  dYdata[IDX(0, 0)] = dYdata[IDX(0, 1)] = dYdata[IDX(0, 2)] = 0.0;
  dYdata[IDX(N - 1, 0)] = dYdata[IDX(N - 1, 1)] = dYdata[IDX(N - 1, 2)] = 0.0;

  /* Return with success */
  return 0;
}